

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  Result RVar1;
  Index IVar2;
  Result RVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  Type type;
  TypeVector actual;
  string local_68;
  string message;
  
  RVar1 = PeekType(this,0,&type);
  if ((type.enum_ == Reference) || (type.enum_ == Any)) {
    if (RVar1.enum_ == Ok) {
      IVar2 = Type::GetReferenceIndex(&type);
      *out_index = IVar2;
      RVar1.enum_ = Ok;
    }
  }
  else {
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (RVar1.enum_ == Ok) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(&actual,&type);
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)&actual,(TypeVector *)0x0,
               (char *)CONCAT71(in_register_00000009,in_CL));
    std::operator+(&message,"type mismatch in call_ref, expected reference but got ",&local_68);
    std::__cxx11::string::_M_dispose();
    PrintError(this,"%s",message._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&actual);
    RVar1.enum_ = Error;
  }
  RVar3 = DropTypes(this,1);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!(type == Type::Any || type.IsReferenceWithIndex())) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in call_ref, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  result |= DropTypes(1);
  return result;
}